

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref.hpp
# Opt level: O0

void __thiscall ftxui::Ref<ftxui::RadioboxOption>::~Ref(Ref<ftxui::RadioboxOption> *this)

{
  Ref<ftxui::RadioboxOption> *this_local;
  
  RadioboxOption::~RadioboxOption(&this->owned_);
  return;
}

Assistant:

Ref(T t) : owned_(t) {}